

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxIn(void *handle,int net_type,char *tx_hex_string,uint32_t index,char **txid,
              uint32_t *vout,uint32_t *sequence,char **script_sig)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint32_t in_ECX;
  char *in_RDX;
  undefined8 *in_R8;
  uint32_t *in_R9;
  uint32_t *in_stack_00000008;
  undefined8 *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  ConfidentialTxInReference ref_1;
  ConfidentialTransactionContext tx_1;
  TxInReference ref;
  TransactionContext tx;
  Script temp_unlocking_script;
  Txid temp_txid;
  bool is_bitcoin;
  int result;
  char *work_script_sig;
  char *work_txid;
  AbstractTxInReference *in_stack_fffffffffffff9e8;
  ConfidentialTxInReference *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  CfdError error_code;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  bool *in_stack_fffffffffffffa48;
  allocator *paVar4;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  int network_type;
  string local_598;
  string local_578;
  Script local_558;
  Txid local_520;
  ConfidentialTxInReference local_500;
  allocator local_399;
  string local_398 [32];
  ConfidentialTransaction local_378 [2];
  Script local_2c0;
  Txid local_288;
  AbstractTxInReference local_268;
  allocator local_1d1;
  string local_1d0 [32];
  Transaction local_1b0 [2];
  Script local_f8;
  Txid local_c0;
  byte local_9b;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  undefined4 local_4c;
  char *local_48;
  char *local_40;
  uint32_t *local_38;
  undefined8 *local_30;
  uint32_t local_24;
  char *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa08 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_4c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_20);
  network_type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa54);
  if (!bVar1) {
    local_9b = 0;
    cfd::capi::ConvertNetType(network_type,in_stack_fffffffffffffa48);
    cfd::core::Txid::Txid(&local_c0);
    cfd::core::Script::Script(&local_f8);
    if ((local_9b & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_398,local_20,&local_399);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)in_stack_fffffffffffff9f0,
                 (string *)in_stack_fffffffffffff9e8);
      std::__cxx11::string::~string(local_398);
      std::allocator<char>::~allocator((allocator<char> *)&local_399);
      cfd::core::ConfidentialTransaction::GetTxIn(&local_500,local_378,local_24);
      cfd::core::AbstractTxInReference::GetTxid(in_stack_fffffffffffff9e8);
      cfd::core::Txid::operator=(&local_c0,&local_520);
      cfd::core::Txid::~Txid((Txid *)0x620847);
      cfd::core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffff9e8);
      cfd::core::Script::operator=(&local_f8,&local_558);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff9f0);
      if (local_38 != (uint32_t *)0x0) {
        uVar2 = cfd::core::AbstractTxInReference::GetVout(&local_500.super_AbstractTxInReference);
        *local_38 = uVar2;
      }
      if (in_stack_00000008 != (uint32_t *)0x0) {
        uVar2 = cfd::core::AbstractTxInReference::GetSequence
                          (&local_500.super_AbstractTxInReference);
        *in_stack_00000008 = uVar2;
      }
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffff9f0);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)in_stack_fffffffffffff9f0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,local_20,&local_1d1);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8
                );
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      cfd::core::Transaction::GetTxIn((TxInReference *)&local_268,local_1b0,local_24);
      cfd::core::AbstractTxInReference::GetTxid(in_stack_fffffffffffff9e8);
      cfd::core::Txid::operator=(&local_c0,&local_288);
      cfd::core::Txid::~Txid((Txid *)0x6205d1);
      cfd::core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffff9e8);
      cfd::core::Script::operator=(&local_f8,&local_2c0);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff9f0);
      if (local_38 != (uint32_t *)0x0) {
        uVar2 = cfd::core::AbstractTxInReference::GetVout(&local_268);
        *local_38 = uVar2;
      }
      if (in_stack_00000008 != (uint32_t *)0x0) {
        uVar2 = cfd::core::AbstractTxInReference::GetSequence(&local_268);
        *in_stack_00000008 = uVar2;
      }
      cfd::core::TxInReference::~TxInReference((TxInReference *)0x620754);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_fffffffffffff9f0);
    }
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::Txid::GetHex_abi_cxx11_(&local_578,&local_c0);
      local_40 = cfd::capi::CreateString((string *)CONCAT44(network_type,in_stack_fffffffffffffa50))
      ;
      std::__cxx11::string::~string((string *)&local_578);
    }
    if (in_stack_00000010 != (undefined8 *)0x0) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_598,&local_f8);
      local_48 = cfd::capi::CreateString((string *)CONCAT44(network_type,in_stack_fffffffffffffa50))
      ;
      std::__cxx11::string::~string((string *)&local_598);
    }
    if (local_40 != (char *)0x0) {
      *local_30 = local_40;
    }
    if (local_48 != (char *)0x0) {
      *in_stack_00000010 = local_48;
    }
    local_4 = 0;
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff9f0);
    cfd::core::Txid::~Txid((Txid *)0x620b4a);
    return local_4;
  }
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0x9b7;
  local_78.funcname = "CfdGetTxIn";
  cfd::core::logger::warn<>(&local_78,"tx is null or empty.");
  local_9a = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  paVar4 = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Failed to parameter. tx is null or empty.",paVar4);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
             error_code,in_stack_fffffffffffffa00);
  local_9a = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxIn(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    char** txid, uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Txid temp_txid;
    Script temp_unlocking_script;
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxInReference ref = tx.GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxInReference ref = tx.GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (txid != nullptr) {
      work_txid = CreateString(temp_txid.GetHex());
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(temp_unlocking_script.GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_script_sig);
  return result;
}